

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringOps.cpp
# Opt level: O3

string * __thiscall
gmlc::utilities::stringOps::trim_abi_cxx11_
          (string *__return_storage_ptr__,stringOps *this,string_view input,string_view whitespace)

{
  void *pvVar1;
  size_type sVar2;
  ulong uVar3;
  char *__n;
  ulong uVar4;
  char *pcVar5;
  char *__str;
  stringOps *psVar6;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  __str = (char *)whitespace._M_len;
  __n = input._M_str;
  pcVar5 = (char *)input._M_len;
  if (this != (stringOps *)0x0) {
    local_40._M_len = (size_t)this;
    local_40._M_str = pcVar5;
    if (__n == (char *)0x0) {
      sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                        (&local_40,__str,0xffffffffffffffff,0);
      psVar6 = (stringOps *)0x0;
LAB_003f7ce9:
      uVar3 = (sVar2 - (long)psVar6) + 1;
      uVar4 = local_40._M_len - (long)psVar6;
      if (uVar3 <= local_40._M_len - (long)psVar6) {
        uVar4 = uVar3;
      }
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)__return_storage_ptr__,psVar6 + (long)local_40._M_str,
                 psVar6 + (long)local_40._M_str + uVar4);
      return __return_storage_ptr__;
    }
    psVar6 = (stringOps *)0x0;
    do {
      pvVar1 = memchr(__str,(int)pcVar5[(long)psVar6],(size_t)__n);
      if (pvVar1 == (void *)0x0) {
        if (psVar6 != (stringOps *)0xffffffffffffffff) {
          sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_not_of
                            (&local_40,__str,0xffffffffffffffff,(size_type)__n);
          if (local_40._M_len < psVar6) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",psVar6);
          }
          goto LAB_003f7ce9;
        }
        break;
      }
      psVar6 = psVar6 + 1;
    } while (this != psVar6);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string trim(std::string_view input, std::string_view whitespace)
    {
        const auto strStart = input.find_first_not_of(whitespace);
        if (strStart == std::string::npos) {
            return {};  // no content
        }

        const auto strEnd = input.find_last_not_of(whitespace);

        return std::string{input.substr(strStart, strEnd - strStart + 1)};
    }